

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MFIter.cpp
# Opt level: O0

Box * __thiscall amrex::MFIter::tilebox(MFIter *this,IntVect *nodal)

{
  int iVar1;
  Box *pBVar2;
  IntVect *pIVar3;
  IntVect *in_RDX;
  MFIter *in_RDI;
  Box *bx;
  int d;
  IntVect *Big;
  Box bx_1;
  Box *valid_cc_box;
  IndexType new_typ;
  int i;
  size_type in_stack_fffffffffffffef8;
  MFIter *this_00;
  int local_e4;
  undefined1 local_d8 [24];
  uint local_c0;
  Box local_bc;
  Box *local_a0;
  IndexType local_94;
  IntVect *local_90;
  IndexType *local_80;
  int local_74;
  IndexType *local_70;
  int local_64;
  IntVect *local_60;
  undefined1 *local_58;
  int local_50;
  int local_4c;
  Box *local_48;
  int local_3c;
  IndexType *local_38;
  undefined4 local_30;
  int local_2c;
  IntVect *local_28;
  int local_1c;
  IndexType *local_18;
  int local_c;
  IndexType *local_8;
  
  this_00 = in_RDI;
  local_90 = in_RDX;
  pBVar2 = Vector<amrex::Box,_std::allocator<amrex::Box>_>::operator[]
                     ((Vector<amrex::Box,_std::allocator<amrex::Box>_> *)in_RDI,
                      in_stack_fffffffffffffef8);
  *(undefined8 *)((IntVect *)&this_00->m_fa)->vect = *(undefined8 *)(pBVar2->smallend).vect;
  this_00->fabArray = *(FabArrayBase **)((pBVar2->smallend).vect + 2);
  *(undefined8 *)(this_00->tile_size).vect = *(undefined8 *)((pBVar2->bigend).vect + 1);
  (this_00->tile_size).vect[2] = (pBVar2->btype).itype;
  IndexType::IndexType(&local_94,local_90);
  local_80 = &local_94;
  if (local_94.itype != 0) {
    Box::setType((Box *)this_00,&local_94);
    validbox(this_00);
    local_58 = local_d8;
    local_48 = &local_bc;
    for (local_4c = 0; local_4c < 3; local_4c = local_4c + 1) {
      local_38 = &local_bc.btype;
      local_3c = local_4c;
      local_1c = local_4c;
      local_c = local_4c;
      if ((local_c0 & 1 << ((byte)local_4c & 0x1f)) != 0) {
        local_28 = &local_bc.bigend;
        local_2c = local_4c;
        local_30 = 0xffffffff;
        local_28->vect[local_4c] = local_28->vect[local_4c] + -1;
      }
      local_18 = local_38;
    }
    local_8 = &local_bc.btype;
    local_a0 = &local_bc;
    pIVar3 = Box::bigEnd(local_a0);
    for (local_e4 = 0; local_e4 < 3; local_e4 = local_e4 + 1) {
      local_70 = &local_94;
      local_74 = local_e4;
      local_50 = local_e4;
      if ((local_94.itype & 1 << ((byte)local_e4 & 0x1f)) != 0) {
        iVar1 = Box::bigEnd((Box *)this_00,local_e4);
        local_64 = local_e4;
        local_60 = pIVar3;
        if (iVar1 == pIVar3->vect[local_e4]) {
          Box::growHi((Box *)this_00,local_e4,1);
        }
      }
    }
  }
  return (Box *)in_RDI;
}

Assistant:

Box
MFIter::tilebox (const IntVect& nodal) const noexcept
{
    BL_ASSERT(tile_array != 0);
    Box bx((*tile_array)[currentIndex]);
    const IndexType new_typ {nodal};
    if (! new_typ.cellCentered())
    {
        bx.setType(new_typ);
        const Box& valid_cc_box = amrex::enclosedCells(validbox());
        const IntVect& Big = valid_cc_box.bigEnd();
        for (int d=0; d<AMREX_SPACEDIM; ++d) {
            if (new_typ.nodeCentered(d)) { // validbox should also be nodal in d-direction.
                if (bx.bigEnd(d) == Big[d]) {
                    bx.growHi(d,1);
                }
            }
        }
    }
    return bx;
}